

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O1

int main(void)

{
  long lVar1;
  testvalue_t tv;
  int iVar2;
  int iVar3;
  _Bool _Var4;
  uint uVar5;
  roaring_bitmap_t *prVar6;
  roaring_bitmap_t *prVar7;
  byte bVar8;
  uint32_t step;
  ulong uVar9;
  roaring_bitmap_t *bm;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  void *pvVar13;
  int i;
  int iVar14;
  long lVar15;
  timespec ts;
  timespec ts_4;
  timespec local_68;
  undefined8 uStack_58;
  undefined4 uStack_50;
  uint uStack_4c;
  timespec local_40;
  
  lVar15 = 0;
  do {
    uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar8 = (byte)(pcg32_global_0 >> 0x3b);
    uVar5 = uVar5 >> bVar8 | uVar5 << 0x20 - bVar8;
    uVar9 = pcg32_global_0;
    while( true ) {
      uVar9 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      bVar8 = (byte)(uVar9 >> 0x38);
      uVar10 = (uint)(uVar9 >> 0x20);
      if (uVar5 < 0xfffffffe) break;
      uVar5 = uVar10 >> 0xd ^ (uint)(uVar9 >> 0x1b);
      bVar8 = bVar8 >> 3;
      uVar5 = uVar5 >> bVar8 | uVar5 << 0x20 - bVar8;
    }
    pcg32_global_0 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar10 = uVar10 >> 0xd ^ (uint)(uVar9 >> 0x1b);
    bVar8 = bVar8 >> 3;
    uVar12 = uVar10 >> bVar8 | uVar10 << 0x20 - bVar8;
    if (uVar10 == 0xffffffff) {
      do {
        uVar9 = pcg32_global_0;
        pcg32_global_0 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar10 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
      } while (uVar10 == 0xffffffff);
      bVar8 = (byte)(uVar9 >> 0x3b);
      uVar12 = uVar10 >> bVar8 | uVar10 << 0x20 - bVar8;
    }
    uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar8 = (byte)(pcg32_global_0 >> 0x3b);
    lVar1 = (ulong)(uVar10 >> bVar8 | uVar10 << 0x20 - bVar8) * 0xffff;
    iVar14 = (int)lVar1;
    while (pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb, iVar14 == 0) {
      uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
      bVar8 = (byte)(pcg32_global_0 >> 0x3b);
      lVar1 = (ulong)(uVar10 >> bVar8 | uVar10 << 0x20 - bVar8) * 0xffff;
      iVar14 = (int)lVar1;
    }
    uVar10 = uVar12;
    if (uVar5 >= uVar12 && uVar5 != uVar12) {
      uVar10 = uVar5;
    }
    uVar11 = uVar12;
    if (uVar5 < uVar12) {
      uVar11 = uVar5;
    }
    uVar10 = (uVar5 == uVar12) + uVar10;
    (&DAT_0012f0f8)[lVar15 * 8] = uVar11;
    (&DAT_0012f0fc)[lVar15 * 8] = uVar10;
    step = (uint32_t)((ulong)lVar1 >> 0x20);
    (&DAT_0012f100)[lVar15 * 8] = step;
    prVar6 = roaring_bitmap_from_range((ulong)uVar11,(ulong)uVar10,step);
    (&run_test_testvalues)[lVar15 * 4] = prVar6;
    uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar8 = (byte)(pcg32_global_0 >> 0x3b);
    uVar5 = uVar5 >> bVar8 | uVar5 << 0x20 - bVar8;
    uVar9 = pcg32_global_0;
    while( true ) {
      uVar9 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      bVar8 = (byte)(uVar9 >> 0x38);
      uVar10 = (uint)(uVar9 >> 0x20);
      if (uVar5 < 0xfffffffe) break;
      uVar5 = uVar10 >> 0xd ^ (uint)(uVar9 >> 0x1b);
      bVar8 = bVar8 >> 3;
      uVar5 = uVar5 >> bVar8 | uVar5 << 0x20 - bVar8;
    }
    pcg32_global_0 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar10 = uVar10 >> 0xd ^ (uint)(uVar9 >> 0x1b);
    bVar8 = bVar8 >> 3;
    uVar12 = uVar10 >> bVar8 | uVar10 << 0x20 - bVar8;
    if (uVar10 == 0xffffffff) {
      do {
        uVar9 = pcg32_global_0;
        pcg32_global_0 = uVar9 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar10 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
      } while (uVar10 == 0xffffffff);
      bVar8 = (byte)(uVar9 >> 0x3b);
      uVar12 = uVar10 >> bVar8 | uVar10 << 0x20 - bVar8;
    }
    uVar10 = uVar12;
    if (uVar5 < uVar12) {
      uVar10 = uVar5;
    }
    uVar11 = uVar12;
    if (uVar12 < uVar5) {
      uVar11 = uVar5;
    }
    uVar11 = (uVar5 == uVar12) + uVar11;
    (&DAT_0012f104)[lVar15 * 8] = uVar10;
    (&DAT_0012f108)[lVar15 * 8] = uVar11;
    prVar7 = roaring_bitmap_from_range((ulong)uVar10,(ulong)uVar11,1);
    _Var4 = roaring_bitmap_intersect(prVar6,prVar7);
    roaring_bitmap_free(prVar7);
    (&DAT_0012f10c)[lVar15 * 0x20] = _Var4;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 100);
  puts("  roaring_bitmap_from_range():");
  iVar14 = 0;
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  lVar15 = 0x18;
  do {
    clock_gettime(3,&local_68);
    iVar2 = (int)local_68.tv_sec;
    iVar3 = (int)local_68.tv_nsec;
    prVar6 = *(roaring_bitmap_t **)((long)&croaring_detect_supported_architectures::buffer + lVar15)
    ;
    prVar7 = roaring_bitmap_from_range
                       ((ulong)*(uint *)(lVar15 + 0x12f0ec),
                        (ulong)*(uint *)((long)&run_test_testvalues + lVar15),1);
    roaring_bitmap_intersect(prVar6,prVar7);
    roaring_bitmap_free(prVar7);
    clock_gettime(3,&local_68);
    iVar14 = ((int)local_68.tv_sec - iVar2) * 1000000000 + ((int)local_68.tv_nsec - iVar3) + iVar14;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0xc98);
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar14 / 100.0),0));
  putchar(10);
  lVar15 = 0;
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  iVar14 = 0;
  do {
    pvVar13 = (void *)0x3;
    clock_gettime(3,&local_68);
    iVar2 = (int)local_68.tv_sec;
    iVar3 = (int)local_68.tv_nsec;
    range_intersect(pvVar13,*(testvalue_t *)((long)&run_test_testvalues + lVar15));
    clock_gettime(3,&local_68);
    iVar14 = ((int)local_68.tv_sec - iVar2) * 1000000000 + ((int)local_68.tv_nsec - iVar3) + iVar14;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0xc80);
  printf(" %.2f cycles per operation",SUB84((double)((float)iVar14 / 100.0),0));
  putchar(10);
  lVar15 = 0;
  fflush((FILE *)0x0);
  do {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)&run_test_testvalues + lVar15));
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0xc80);
  prVar6 = roaring_bitmap_from_range(0,0xfffffffe,2);
  local_68.tv_nsec = -0x200000000;
  uStack_58 = 0xfffffffd00000002;
  uStack_50 = 0xffffffff;
  uStack_4c = uStack_4c & 0xffffff00;
  local_68.tv_sec = (__time_t)prVar6;
  prVar7 = roaring_bitmap_from_range(0xfffffffd,0xffffffff,1);
  _Var4 = roaring_bitmap_intersect(prVar6,prVar7);
  roaring_bitmap_free(prVar7);
  uStack_4c = CONCAT31(uStack_4c._1_3_,_Var4);
  puts("  roaring_bitmap_from_range():");
  printf("%s %s: ","naive_intersect","pre");
  fflush((FILE *)0x0);
  clock_gettime(3,&local_40);
  iVar2 = (int)local_40.tv_nsec;
  iVar14 = (int)local_40.tv_sec;
  prVar7 = roaring_bitmap_from_range(0xfffffffd,0xffffffff,1);
  roaring_bitmap_intersect(prVar6,prVar7);
  roaring_bitmap_free(prVar7);
  clock_gettime(3,&local_40);
  printf(" %.2f cycles per operation",
         SUB84((double)(((int)local_40.tv_sec - iVar14) * 1000000000 +
                       ((int)local_40.tv_nsec - iVar2)),0));
  putchar(10);
  fflush((FILE *)0x0);
  puts("  roaring_bitmap_intersect_with_range():");
  printf("%s %s: ","range_intersect","pre");
  fflush((FILE *)0x0);
  pvVar13 = (void *)0x3;
  clock_gettime(3,&local_40);
  iVar2 = (int)local_40.tv_nsec;
  iVar14 = (int)local_40.tv_sec;
  tv._28_4_ = uStack_4c;
  tv.range[1] = uStack_50;
  tv.bitmap_range[0] = (int)local_68.tv_nsec;
  tv.bitmap_range[1] = local_68.tv_nsec._4_4_;
  tv.bitmap = (roaring_bitmap_t *)local_68.tv_sec;
  tv.bitmap_range[2] = (undefined4)uStack_58;
  tv.range[0] = uStack_58._4_4_;
  range_intersect(pvVar13,tv);
  clock_gettime(3,&local_40);
  printf(" %.2f cycles per operation",
         SUB84((double)(((int)local_40.tv_sec - iVar14) * 1000000000 +
                       ((int)local_40.tv_nsec - iVar2)),0));
  putchar(10);
  fflush((FILE *)0x0);
  roaring_bitmap_free(prVar6);
  return 0;
}

Assistant:

int main(void) {
    run_test();
    return 0;
}